

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_LRU.cc
# Opt level: O0

void __thiscall MyDB_LRU::MyDB_LRU(MyDB_LRU *this,int size)

{
  Node *pNVar1;
  int size_local;
  MyDB_LRU *this_local;
  
  std::
  map<std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>_>_>
  ::map(&this->LRUmap);
  this->size = size;
  pNVar1 = (Node *)operator_new(0x18);
  pNVar1->pre = (Node *)0x0;
  pNVar1->next = (Node *)0x0;
  pNVar1->page = (MyDB_PageBase *)0x0;
  this->head = pNVar1;
  pNVar1 = (Node *)operator_new(0x18);
  memset(pNVar1,0,0x18);
  this->tail = pNVar1;
  this->head->next = this->tail;
  this->tail->pre = this->head;
  return;
}

Assistant:

MyDB_LRU:: MyDB_LRU(int size) {
    this -> size = size;
    this -> head = new Node();
    this -> tail = new Node();
    this -> head -> next = this -> tail;
    this -> tail -> pre = this -> head;
}